

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O3

void save_resets(FILE *fp,AREA_DATA_conflict *pArea)

{
  short sVar1;
  bool bVar2;
  ROOM_INDEX_DATA *pRVar3;
  ulong uVar4;
  ulong uVar5;
  RESET_DATA *pRVar6;
  char *pcVar7;
  int iVar8;
  
  fwrite("#RESETS\n",8,1,(FILE *)fp);
  iVar8 = (int)pArea->min_vnum;
  if (pArea->min_vnum <= pArea->max_vnum) {
    do {
      pRVar3 = get_room_index(0);
      if (pRVar3 != (ROOM_INDEX_DATA *)0x0) {
        for (pRVar6 = pRVar3->reset_first; pRVar6 != (RESET_DATA *)0x0; pRVar6 = pRVar6->next) {
          switch(pRVar6->command) {
          case 'D':
            pcVar7 = "LOCKED";
            if (pRVar6->arg3 == 1) {
              pcVar7 = "CLOSED";
            }
            if (pRVar6->arg3 == 0) {
              pcVar7 = "OPEN";
            }
            fprintf((FILE *)fp,"DOOR %d %s %s\n",(ulong)(uint)(int)pRVar6->arg1,
                    direction_table[pRVar6->arg2].name,pcVar7);
            break;
          case 'E':
            sVar1 = pRVar6->arg1;
            pcVar7 = flag_name_lookup((long)pRVar6->arg3,wear_locations);
            pcVar7 = upstring(pcVar7);
            fprintf((FILE *)fp,"EQUIP %d %s\n",(ulong)(uint)(int)sVar1,pcVar7);
            break;
          case 'F':
            uVar5 = (ulong)(uint)(int)pRVar6->arg1;
            uVar4 = (ulong)(uint)(int)pRVar6->arg2;
            pcVar7 = "FOLLOW %d %d\n";
            goto LAB_0036458b;
          case 'G':
            fprintf((FILE *)fp,"GIVE %d\n",(ulong)(uint)(int)pRVar6->arg1);
            break;
          case 'M':
            fprintf((FILE *)fp,"MOB %d TO %d GLIMIT %d LLIMIT %d\n",(ulong)(uint)(int)pRVar6->arg1,
                    (ulong)(uint)(int)pRVar6->arg3,(ulong)(uint)(int)pRVar6->arg2,
                    (ulong)(uint)(int)pRVar6->arg4);
            break;
          case 'O':
            uVar5 = (ulong)(uint)(int)pRVar6->arg1;
            uVar4 = (ulong)(uint)(int)pRVar6->arg3;
            pcVar7 = "OBJECT %d TO %d\n";
            goto LAB_0036458b;
          case 'P':
            fprintf((FILE *)fp,"PUT %d IN %d COUNT %d\n",(ulong)(uint)(int)pRVar6->arg1,
                    (ulong)(uint)(int)pRVar6->arg3,(ulong)(uint)(int)pRVar6->arg4);
            break;
          case 'R':
            uVar5 = (ulong)(uint)(int)pRVar6->arg1;
            uVar4 = (ulong)(uint)(int)pRVar6->arg2;
            pcVar7 = "RANDOMIZE %d %d\n";
LAB_0036458b:
            fprintf((FILE *)fp,pcVar7,uVar5,uVar4);
          }
        }
      }
      bVar2 = iVar8 < pArea->max_vnum;
      iVar8 = iVar8 + 1;
    } while (bVar2);
  }
  fwrite("S\n\n",3,1,(FILE *)fp);
  return;
}

Assistant:

void save_resets(FILE *fp, AREA_DATA *pArea)
{
	RESET_DATA *pReset;
	ROOM_INDEX_DATA *pRoomIndex;
	int i;

	fprintf(fp, "#RESETS\n");

	for (i = pArea->min_vnum; i < (pArea->max_vnum + 1); i++)
	{
		if ((pRoomIndex = get_room_index(i)) == nullptr)
			continue;

		for (pReset = pRoomIndex->reset_first; pReset != nullptr; pReset = pReset->next)
		{
			switch (pReset->command)
			{
				case 'M':
					fprintf(fp, "MOB %d TO %d GLIMIT %d LLIMIT %d\n", pReset->arg1, pReset->arg3, pReset->arg2, pReset->arg4);
					break;
				case 'O':
					fprintf(fp, "OBJECT %d TO %d\n", pReset->arg1, pReset->arg3);
					break;
				case 'P':
					fprintf(fp, "PUT %d IN %d COUNT %d\n", pReset->arg1, pReset->arg3, pReset->arg4);
					break;
				case 'G':
					fprintf(fp, "GIVE %d\n", pReset->arg1);
					break;
				case 'F':
					fprintf(fp, "FOLLOW %d %d\n", pReset->arg1, pReset->arg2);
					break;
				case 'E':
					fprintf(fp, "EQUIP %d %s\n", pReset->arg1, (upstring(flag_name_lookup(pReset->arg3, wear_locations))));
					break;
				case 'D':
					fprintf(fp, "DOOR %d %s %s\n",
						pReset->arg1,
						direction_table[pReset->arg2].name,
						pReset->arg3 == 0 ? "OPEN" : 
							pReset->arg3 == 1 ? "CLOSED" : "LOCKED");
					break;
				case 'R':
					fprintf(fp, "RANDOMIZE %d %d\n", pReset->arg1, pReset->arg2);
					break;
				default:
					break;
			}
		}
	}

	fprintf(fp, "S\n\n");
}